

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O0

void out(char *p,char *m1)

{
  buffer *s;
  int *piVar1;
  char *buf;
  char *m1_local;
  char *p_local;
  
  buffer_puts(buffer_1,p);
  buffer_puts(buffer_1,*service);
  if (islog != 0) {
    buffer_puts(buffer_1,"/log");
  }
  buffer_puts(buffer_1,": ");
  buffer_puts(buffer_1,m1);
  piVar1 = __errno_location();
  if (*piVar1 != 0) {
    buffer_puts(buffer_1,": ");
    s = buffer_1;
    piVar1 = __errno_location();
    buf = error_str(*piVar1);
    buffer_puts(s,buf);
  }
  buffer_puts(buffer_1,"\n");
  buffer_flush(buffer_1);
  return;
}

Assistant:

void out(char *p, char *m1) {
  buffer_puts(buffer_1, p);
  buffer_puts(buffer_1, *service);
  if (islog) buffer_puts(buffer_1, "/log");
  buffer_puts(buffer_1, ": ");
  buffer_puts(buffer_1, m1);
  if (errno) {
    buffer_puts(buffer_1, ": ");
    buffer_puts(buffer_1, error_str(errno));
  }
  buffer_puts(buffer_1, "\n");
  buffer_flush(buffer_1);
}